

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O0

float PsiEN(float *ve,float *va)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  float n [2];
  float v2;
  float v1;
  float nve;
  float nva;
  float *va_local;
  float *ve_local;
  
  fVar4 = norm(va,2);
  fVar5 = norm(ve,2);
  if (fVar5 <= 1e-08) {
    n[1] = 100.0;
  }
  else {
    fVar1 = *ve;
    fVar2 = ve[1];
    fVar6 = *va;
    fVar3 = va[1];
    dVar7 = sqrt((double)(fVar4 * fVar4) + 1.0);
    dVar8 = sqrt((double)(fVar5 * fVar5) + 1.0);
    fVar6 = (float)((double)((fVar6 * (fVar1 / fVar5) + fVar3 * (fVar2 / fVar5)) - fVar5) /
                   (dVar7 * dVar8));
    dVar7 = asin((double)fVar6);
    n[1] = (float)((dVar7 * 180.0) / 3.141592653589793);
    if ((n[1] < -90.0) || (90.0 < n[1])) {
      printf("ERROR in PSIEN()  v1: %f ve: %f\n",(double)n[1],SUB84((double)fVar6,0));
      printf("nve: %f nva: %f\n",(double)fVar5,SUB84((double)fVar4,0));
      printf("n: %f %f\n",(double)(fVar1 / fVar5),SUB84((double)(fVar2 / fVar5),0));
      printf(" ve: %f %f va: %f %f\n",(double)*ve,SUB84((double)ve[1],0),(double)*va,(double)va[1]);
      fflush(_stdout);
    }
  }
  return ABS(n[1]);
}

Assistant:

float PsiEN(float ve[],float va[])
{
float nva,nve;
float v1,v2;
float n[2];

nva = norm(va,2), nve = norm(ve,2);
if(nve > 0.00000001)
{
n[0] = ve[0]/nve;
n[1] = ve[1]/nve;
v1 = (va[0]*n[0] + va[1]*n[1]-nve) ;
v2 = (float) (v1/(sqrt((1.0+nva*nva))*sqrt((1.0+nve*nve))));
v1 =  (float) (asin(v2)*180.0/HALF_C);

if(!(v1>=-90.0 && v1<=90.0))
	{
       	printf("ERROR in PSIEN()  v1: %f ve: %f\n",v1,v2);
	printf("nve: %f nva: %f\n",nve,nva);
	printf("n: %f %f\n",n[0],n[1]);
	printf(" ve: %f %f va: %f %f\n",ve[0],ve[1],va[0],va[1]);
	fflush(stdout);
	}
}
else v1 = NO_VALUE;

return (float) fabs(v1);
}